

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O3

void predict_or_learn_with_confidence<false,true>
               (confidence *param_1,single_learner *base,example *ec)

{
  float fVar1;
  
  fVar1 = (ec->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  }
  (ec->l).simple.label = fVar1;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  fVar1 = (float)(**(code **)(base + 0x50))
                           (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
  ec->confidence = ABS((ec->pred).scalar) / fVar1;
  return;
}

Assistant:

void predict_or_learn_with_confidence(confidence& /* c */, single_learner& base, example& ec)
{
  float threshold = 0.f;
  float sensitivity = 0.f;

  float existing_label = ec.l.simple.label;
  if (existing_label == FLT_MAX)
    {
      base.predict(ec);
      float opposite_label = 1.f;
      if (ec.pred.scalar > 0)
        opposite_label = -1.f;
      ec.l.simple.label = opposite_label;
    }

  if (!is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.l.simple.label = existing_label;
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.confidence = fabsf(ec.pred.scalar - threshold) / sensitivity;
}